

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parserInternals.c
# Opt level: O0

int xmlSwitchToEncoding(xmlParserCtxtPtr ctxt,xmlCharEncodingHandlerPtr handler)

{
  xmlParserErrors code_00;
  xmlParserErrors code;
  xmlCharEncodingHandlerPtr handler_local;
  xmlParserCtxtPtr ctxt_local;
  
  if (ctxt == (xmlParserCtxtPtr)0x0) {
    ctxt_local._4_4_ = -1;
  }
  else {
    code_00 = xmlInputSetEncodingHandler(ctxt->input,handler);
    if (code_00 == XML_ERR_OK) {
      ctxt_local._4_4_ = 0;
    }
    else {
      xmlCtxtErrIO(ctxt,code_00,(char *)0x0);
      ctxt_local._4_4_ = -1;
    }
  }
  return ctxt_local._4_4_;
}

Assistant:

int
xmlSwitchToEncoding(xmlParserCtxtPtr ctxt, xmlCharEncodingHandlerPtr handler)
{
    xmlParserErrors code;

    if (ctxt == NULL)
        return(-1);

    code = xmlInputSetEncodingHandler(ctxt->input, handler);
    if (code != XML_ERR_OK) {
        xmlCtxtErrIO(ctxt, code, NULL);
        return(-1);
    }

    return(0);
}